

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1534.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar7;
  long lVar8;
  long filetime;
  long local_30;
  
  iVar1 = curl_global_init(3);
  uVar6 = _stderr;
  if (iVar1 != 0) {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar6,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1534.c"
                  ,0x22,iVar1,uVar3);
    return iVar1;
  }
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    lVar8 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1534.c"
                  ,0x24);
    iVar1 = 0x7c;
    goto LAB_00102359;
  }
  iVar1 = curl_easy_getinfo(lVar4,0x20000e,&local_30);
  uVar6 = _stderr;
  if (iVar1 == 0) {
    if (local_30 != -1) {
      lVar8 = 0;
      uVar6 = 0x31;
LAB_0010234d:
      curl_mfprintf(_stderr,"%s:%d filetime init failed; expected -1 but is %ld\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1534.c"
                    ,uVar6);
LAB_00102354:
      iVar1 = 2;
      goto LAB_00102359;
    }
    iVar1 = curl_easy_setopt(lVar4,0x2712,URL);
    uVar6 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar4,0x45,1);
      uVar6 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_perform(lVar4);
        uVar6 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_getinfo(lVar4,0x20000e,&local_30);
          uVar6 = _stderr;
          if (iVar1 == 0) {
            if (local_30 != 0x1e) {
              lVar8 = 0;
              curl_mfprintf(_stderr,
                            "%s:%d filetime of http resource is incorrect; expected 30 but is %ld\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1534.c"
                            ,0x4c);
              iVar1 = 0x16;
              goto LAB_00102359;
            }
            lVar8 = curl_easy_duphandle(lVar4);
            if (lVar8 == 0) {
              lVar8 = 0;
              curl_mfprintf(_stderr,"%s:%d curl_easy_duphandle() failed\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1534.c"
                            ,0x57);
              goto LAB_00102354;
            }
            iVar1 = curl_easy_getinfo(lVar8,0x20000e,&local_30);
            uVar6 = _stderr;
            if (iVar1 == 0) {
              if (local_30 == -1) {
                curl_easy_reset(lVar4);
                iVar1 = 0;
                iVar2 = curl_easy_getinfo(lVar4,0x20000e,&local_30);
                uVar6 = _stderr;
                if (iVar2 != 0) {
                  uVar3 = curl_easy_strerror(iVar2);
                  curl_mfprintf(uVar6,"%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1534.c"
                                ,0x72,iVar2,uVar3);
                  iVar1 = iVar2;
                  goto LAB_00102359;
                }
                if (local_30 == -1) goto LAB_00102359;
                uVar6 = 0x77;
              }
              else {
                uVar6 = 100;
              }
              goto LAB_0010234d;
            }
            uVar3 = curl_easy_strerror(iVar1);
            pcVar7 = "%s:%d curl_easy_getinfo() failed with code %d (%s)\n";
            uVar5 = 0x5f;
          }
          else {
            uVar3 = curl_easy_strerror(iVar1);
            pcVar7 = "%s:%d curl_easy_getinfo() failed with code %d (%s)\n";
            lVar8 = 0;
            uVar5 = 0x46;
          }
        }
        else {
          uVar3 = curl_easy_strerror(iVar1);
          pcVar7 = "%s:%d curl_easy_perform() failed with code %d (%s)\n";
          lVar8 = 0;
          uVar5 = 0x3c;
        }
      }
      else {
        uVar3 = curl_easy_strerror(iVar1);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar8 = 0;
        uVar5 = 0x37;
      }
    }
    else {
      uVar3 = curl_easy_strerror(iVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar8 = 0;
      uVar5 = 0x36;
    }
  }
  else {
    uVar3 = curl_easy_strerror(iVar1);
    pcVar7 = "%s:%d curl_easy_getinfo() failed with code %d (%s)\n";
    lVar8 = 0;
    uVar5 = 0x2c;
  }
  curl_mfprintf(uVar6,pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1534.c"
                ,uVar5,iVar1,uVar3);
LAB_00102359:
  curl_easy_cleanup(lVar4);
  curl_easy_cleanup(lVar8);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curl, *dupe = NULL;
  long filetime;
  int res = CURLE_OK;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  /* Test that a filetime is properly initialized on curl_easy_init.
  */

  res = curl_easy_getinfo(curl, CURLINFO_FILETIME, &filetime);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(filetime != -1) {
    fprintf(stderr, "%s:%d filetime init failed; expected -1 but is %ld\n",
            __FILE__, __LINE__, filetime);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_FILETIME, 1L);

  res = curl_easy_perform(curl);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_perform() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }

  /* Test that a filetime is properly set after receiving an HTTP resource.
  */

  res = curl_easy_getinfo(curl, CURLINFO_FILETIME, &filetime);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(filetime != 30) {
    fprintf(stderr, "%s:%d filetime of http resource is incorrect; "
            "expected 30 but is %ld\n",
            __FILE__, __LINE__, filetime);
    res = CURLE_HTTP_RETURNED_ERROR;
    goto test_cleanup;
  }

  /* Test that a filetime is properly initialized on curl_easy_duphandle.
  */

  dupe = curl_easy_duphandle(curl);
  if(!dupe) {
    fprintf(stderr, "%s:%d curl_easy_duphandle() failed\n",
            __FILE__, __LINE__);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

  res = curl_easy_getinfo(dupe, CURLINFO_FILETIME, &filetime);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(filetime != -1) {
    fprintf(stderr, "%s:%d filetime init failed; expected -1 but is %ld\n",
            __FILE__, __LINE__, filetime);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }


  /* Test that a filetime is properly initialized on curl_easy_reset.
  */

  curl_easy_reset(curl);

  res = curl_easy_getinfo(curl, CURLINFO_FILETIME, &filetime);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(filetime != -1) {
    fprintf(stderr, "%s:%d filetime init failed; expected -1 but is %ld\n",
            __FILE__, __LINE__, filetime);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

test_cleanup:
  curl_easy_cleanup(curl);
  curl_easy_cleanup(dupe);
  curl_global_cleanup();
  return res;
}